

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O3

void drop_weapon(int alone)

{
  obj *obj;
  char *pcVar1;
  obj *obj_00;
  
  obj = uwep;
  if (uwep == (obj *)0x0) {
    return;
  }
  if (alone != 0) {
    if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
      if ((youmonst.data)->mattk[1].aatyp == 0xfe) {
        return;
      }
      goto LAB_0021a592;
    }
    pcVar1 = "s";
    if (u.twoweap == '\0') {
      pcVar1 = "";
    }
    pline("You find you must drop your weapon%s!",pcVar1);
  }
  obj_00 = uswapwep;
  if (u.twoweap == '\0') {
    obj_00 = (obj *)0x0;
  }
  uwepgone();
  if (((obj->field_0x4a & 1) == 0) || (obj->otyp != 0x210)) {
    dropx(obj);
  }
  if ((obj_00 != (obj *)0x0) &&
     ((uswapwepgone(), (obj_00->field_0x4a & 1) == 0 || (obj_00->otyp != 0x210)))) {
    dropx(obj_00);
  }
LAB_0021a592:
  untwoweapon();
  return;
}

Assistant:

static void drop_weapon(int alone)
{
    struct obj *otmp;
    struct obj *otmp2;

    if ((otmp = uwep) != 0) {
	/* !alone check below is currently superfluous but in the
	 * future it might not be so if there are monsters which cannot
	 * wear gloves but can wield weapons
	 */
	if (!alone || cantwield(youmonst.data)) {
	    struct obj *wep = uwep;

	    if (alone) pline("You find you must drop your weapon%s!",
			   	u.twoweap ? "s" : "");
	    otmp2 = u.twoweap ? uswapwep : 0;
	    uwepgone();
	    if (!wep->cursed || wep->otyp != LOADSTONE)
		dropx(otmp);
	    if (otmp2 != 0) {
		uswapwepgone();
		if (!otmp2->cursed || otmp2->otyp != LOADSTONE)
		    dropx(otmp2);
	    }
	    untwoweapon();
	} else if (!could_twoweap(youmonst.data)) {
	    untwoweapon();
	}
    }
}